

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DwaCompressor::classifyChannels
          (DwaCompressor *this,ChannelList *channels,
          vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *chanData,
          vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
          *cscData)

{
  _Rb_tree_node_base *__args;
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  pointer pCVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  pointer pCVar7;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *this_00;
  undefined4 uVar8;
  size_type sVar9;
  bool bVar10;
  uint uVar11;
  iterator iVar12;
  Iterator IVar13;
  long lVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  _Rb_tree_node_base *p_Var17;
  ulong uVar18;
  ChannelList *this_01;
  ulong __new_size;
  size_type sVar19;
  pointer this_02;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  tmpCscSet;
  string prefix;
  string suffix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  prefixMap;
  void *local_108;
  CscChannelSet *pCStack_100;
  CscChannelSet *local_f8;
  key_type local_e8;
  ChannelList *local_c8;
  string local_c0;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *local_a0;
  size_type local_98;
  DwaCompressor *local_90;
  size_type local_88;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sVar19 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = (CscChannelSet *)0x0;
  local_108 = (void *)0x0;
  pCStack_100 = (CscChannelSet *)0x0;
  local_a0 = cscData;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar12._M_node = (_Base_ptr)ChannelList::begin(channels);
  while( true ) {
    IVar13 = ChannelList::end(channels);
    if ((iterator)iVar12._M_node == IVar13._i._M_node) break;
    sVar19 = (size_type)((int)sVar19 + 1);
    iVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node);
  }
  local_c8 = channels;
  if ((int)sVar19 != 0) {
    std::
    vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
    ::resize(chanData,sVar19);
  }
  this_01 = local_c8;
  local_98 = sVar19;
  local_88 = sVar19;
  iVar12._M_node = (_Base_ptr)ChannelList::begin(local_c8);
  uVar18 = 0;
  while (IVar13 = ChannelList::end(this_01), (iterator)iVar12._M_node != IVar13._i._M_node) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,(char *)(iVar12._M_node + 1),(allocator<char> *)&local_c0);
    std::__cxx11::string::operator=
              ((string *)
               ((chanData->
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar18),(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pCVar4 = (chanData->
             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar4[uVar18].compression = UNKNOWN;
    uVar5 = *(undefined8 *)&iVar12._M_node[9].field_0x4;
    pCVar4[uVar18].xSampling = (int)uVar5;
    pCVar4[uVar18].ySampling = (int)((ulong)uVar5 >> 0x20);
    pCVar4[uVar18].type = iVar12._M_node[9]._M_color;
    pCVar4[uVar18].pLinear = *(bool *)((long)&iVar12._M_node[9]._M_parent + 4);
    uVar18 = (ulong)((int)uVar18 + 1);
    iVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node);
    this_01 = local_c8;
  }
  if ((int)local_98 != 0) {
    sVar19 = 0;
    local_90 = this;
    do {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      pCVar4 = (chanData->
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      _Var6._M_p = pCVar4[sVar19].name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,_Var6._M_p,_Var6._M_p + pCVar4[sVar19].name._M_string_length);
      lVar14 = std::__cxx11::string::rfind((char)&local_c0,0x2e);
      if (lVar14 != -1) {
        std::__cxx11::string::substr((ulong)local_80,(ulong)&local_c0);
        std::__cxx11::string::operator=((string *)&local_e8,(string *)local_80);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        std::__cxx11::string::substr((ulong)local_80,(ulong)&local_c0);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)local_80);
        this = local_90;
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
          this = local_90;
        }
      }
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
               ::find(&local_60,&local_e8);
      if ((_Rb_tree_header *)iVar15._M_node == &local_60._M_impl.super__Rb_tree_header) {
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                                *)&local_60,&local_e8);
        pmVar16->idx[0] = -1;
        pmVar16->idx[1] = -1;
        pmVar16->idx[2] = -1;
      }
      for (this_02 = (this->_channelRules).
                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          this_02 !=
          (this->_channelRules).
          super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
          ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
        bVar10 = Classifier::match(this_02,&local_c0,
                                   (chanData->
                                   super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                   )._M_impl.super__Vector_impl_data._M_start[sVar19].type);
        if ((bVar10) &&
           ((chanData->
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            )._M_impl.super__Vector_impl_data._M_start[sVar19].compression = this_02->_scheme,
           -1 < this_02->_cscIdx)) {
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                                  *)&local_60,&local_e8);
          pmVar16->idx[this_02->_cscIdx] = (int)sVar19;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      sVar9 = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar9);
  }
  this_00 = local_a0;
  p_Var17 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (local_a0 = this_00, (_Rb_tree_header *)p_Var17 != &local_60._M_impl.super__Rb_tree_header)
  {
    _Var1 = p_Var17[2]._M_color;
    _Var2 = *(_Rb_tree_color *)&p_Var17[2].field_0x4;
    _Var3 = *(_Rb_tree_color *)&p_Var17[2]._M_parent;
    if (-1 < (int)(_Var1 | _Var2 | _Var3)) {
      pCVar4 = (chanData->
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((pCVar4[_Var1].xSampling == pCVar4[_Var2].xSampling) &&
           (pCVar4[_Var1].xSampling == pCVar4[_Var3].xSampling)) &&
          (pCVar4[_Var1].ySampling == pCVar4[_Var2].ySampling)) &&
         (pCVar4[_Var1].ySampling == pCVar4[_Var3].ySampling)) {
        __args = p_Var17 + 2;
        if (pCStack_100 == local_f8) {
          std::
          vector<Imf_2_5::DwaCompressor::CscChannelSet,std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>>
          ::_M_realloc_insert<Imf_2_5::DwaCompressor::CscChannelSet_const&>
                    ((vector<Imf_2_5::DwaCompressor::CscChannelSet,std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>>
                      *)&local_108,(iterator)pCStack_100,(CscChannelSet *)__args);
        }
        else {
          pCStack_100->idx[2] = *(int *)&p_Var17[2]._M_parent;
          uVar8 = *(undefined4 *)&__args->field_0x4;
          pCStack_100->idx[0] = __args->_M_color;
          pCStack_100->idx[1] = uVar8;
          pCStack_100 = pCStack_100 + 1;
        }
      }
    }
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    this_00 = local_a0;
  }
  if ((long)pCStack_100 - (long)local_108 != 0) {
    __new_size = ((long)pCStack_100 - (long)local_108 >> 2) * -0x5555555555555555;
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::resize(this_00,__new_size);
    uVar11 = 1;
    uVar18 = 0;
    do {
      pCVar7 = (this_00->
               super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar7[uVar18].idx[2] = *(int *)((long)local_108 + uVar18 * 0xc + 8);
      *(undefined8 *)pCVar7[uVar18].idx = *(undefined8 *)((long)local_108 + uVar18 * 0xc);
      uVar18 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar18 <= __new_size && __new_size - uVar18 != 0);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
DwaCompressor::classifyChannels
    (ChannelList channels,
     std::vector<ChannelData> &chanData,
     std::vector<CscChannelSet> &cscData)
{
    //
    // prefixMap used to map channel name prefixes to 
    // potential CSC-able sets of channels.
    //

    std::map<std::string, DwaCompressor::CscChannelSet> prefixMap;
    std::vector<DwaCompressor::CscChannelSet>           tmpCscSet;

    unsigned int numChan = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
        numChan++;
    
    if (numChan)
        chanData.resize (numChan);

    //
    // Cache the relevant data from the channel structs.
    //

    unsigned int offset = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
    {
        chanData[offset].name        = std::string (c.name());
        chanData[offset].compression = UNKNOWN;
        chanData[offset].xSampling   = c.channel().xSampling;
        chanData[offset].ySampling   = c.channel().ySampling;
        chanData[offset].type        = c.channel().type;
        chanData[offset].pLinear     = c.channel().pLinear;

        offset++;
    }

    //
    // Try and figure out which channels should be
    // compressed by which means.
    //

    for (offset = 0; offset<numChan; ++offset)
    {
        std::string prefix  = "";
        std::string suffix  = chanData[offset].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
        {
            prefix = suffix.substr (0,         lastDot);
            suffix = suffix.substr (lastDot+1, std::string::npos);
        } 

        //
        // Make sure we have an entry in our CSC set map 
        //

        std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
            theSet = prefixMap.find (prefix);

        if (theSet == prefixMap.end())
        {
            DwaCompressor::CscChannelSet tmpSet;

            tmpSet.idx[0] = 
            tmpSet.idx[1] = 
            tmpSet.idx[2] = -1;

            prefixMap[prefix] = tmpSet;
        }

        // 
        // Check the suffix against the list of classifications
        // we defined previously. If the _cscIdx is not negative,
        // it indicates that we should be part of a CSC group.
        //

        for (std::vector<Classifier>::iterator i = _channelRules.begin();
             i != _channelRules.end();
             ++i)
        {
            if ( i->match(suffix, chanData[offset].type) )
            {
                chanData[offset].compression = i->_scheme;

                if ( i->_cscIdx >= 0)
                    prefixMap[prefix].idx[i->_cscIdx] = offset;
            }
        }
    }

    //
    // Finally, try and find RGB sets of channels which 
    // can be CSC'ed to a Y'CbCr space prior to loss, for
    // better compression.
    //
    // Walk over our set of candidates, and see who has
    // all three channels defined (and has common sampling
    // patterns, etc).
    //

    for (std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
         theItem = prefixMap.begin(); theItem != prefixMap.end();
         ++theItem)
    {
        int red = (*theItem).second.idx[0];
        int grn = (*theItem).second.idx[1];
        int blu = (*theItem).second.idx[2];

        if ((red < 0) || (grn < 0) || (blu < 0))
            continue;

        if ((chanData[red].xSampling != chanData[grn].xSampling) ||
            (chanData[red].xSampling != chanData[blu].xSampling) ||
            (chanData[grn].xSampling != chanData[blu].xSampling) ||
            (chanData[red].ySampling != chanData[grn].ySampling) ||
            (chanData[red].ySampling != chanData[blu].ySampling) ||
            (chanData[grn].ySampling != chanData[blu].ySampling))
        {
            continue;
        }
        
        tmpCscSet.push_back ((*theItem).second);
    }
    
    size_t numCsc = tmpCscSet.size();

    if (numCsc)
        cscData.resize(numCsc);

    for (offset = 0; offset < numCsc; ++offset)
        cscData[offset] = tmpCscSet[offset];
}